

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

void absl::lts_20250127::functional_internal::
     InvokeObject<google::protobuf::DescriptorPool::BuildFileFromDatabase(google::protobuf::FileDescriptorProto_const&,google::protobuf::DescriptorPool::DeferredValidation&)const::__0,void>
               (VoidPtr ptr)

{
  DescriptorPool *pool;
  __uniq_ptr_data<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>,_true,_true>
  in_RAX;
  FileDescriptor *pFVar1;
  __uniq_ptr_impl<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
  local_18;
  
  pool = *(DescriptorPool **)(ptr.fun + 8);
  local_18._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorBuilder_*,_std::default_delete<google::protobuf::DescriptorBuilder>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorBuilder_*,_false>._M_head_impl =
       (tuple<google::protobuf::DescriptorBuilder_*,_std::default_delete<google::protobuf::DescriptorBuilder>_>
        )(tuple<google::protobuf::DescriptorBuilder_*,_std::default_delete<google::protobuf::DescriptorBuilder>_>
          )in_RAX.
           super___uniq_ptr_impl<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::DescriptorBuilder_*,_std::default_delete<google::protobuf::DescriptorBuilder>_>
           .super__Head_base<0UL,_google::protobuf::DescriptorBuilder_*,_false>._M_head_impl;
  google::protobuf::DescriptorBuilder::New
            ((DescriptorBuilder *)&stack0xffffffffffffffe8,pool,
             (pool->tables_)._M_t.
             super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
             .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl,
             *(DeferredValidation **)(ptr.fun + 0x10),pool->default_error_collector_);
  pFVar1 = google::protobuf::DescriptorBuilder::BuildFile
                     ((DescriptorBuilder *)
                      local_18._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorBuilder_*,_std::default_delete<google::protobuf::DescriptorBuilder>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorBuilder_*,_false>.
                      _M_head_impl,*(FileDescriptorProto **)(ptr.fun + 0x18));
  **ptr.obj = pFVar1;
  std::
  unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
  ::~unique_ptr((unique_ptr<google::protobuf::DescriptorBuilder,_std::default_delete<google::protobuf::DescriptorBuilder>_>
                 *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}